

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.cpp
# Opt level: O0

void __thiscall ScopeNode::ScopeNode(ScopeNode *this)

{
  ScopeNode local_68;
  ScopeNode *local_10;
  ScopeNode *this_local;
  
  local_10 = this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Symbol>_>_>
  ::map(&this->symbols_);
  this->enclosing_scope_ = (ScopeNode *)0x0;
  std::__cxx11::list<ScopeNode_*,_std::allocator<ScopeNode_*>_>::list(&this->children_);
  ScopeNode(&local_68,(ScopeNode *)0x0);
  ~ScopeNode(&local_68);
  return;
}

Assistant:

ScopeNode::ScopeNode() : enclosing_scope_(nullptr) {
    ScopeNode(nullptr);
}